

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

bool __thiscall
glcts::ViewportArray::ScissorClear::checkResults
          (ScissorClear *this,texture *texture_0,texture *param_2,GLuint param_3)

{
  bool bVar1;
  GLuint y;
  GLuint y_00;
  ulong uVar2;
  GLuint x;
  bool bVar3;
  vector<int,_std::allocator<int>_> texture_data;
  vector<int,_std::allocator<int>_> local_48;
  
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&local_48,0x40000);
  Utils::texture::get(texture_0,0x8d94,0x1404,
                      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  uVar2 = 0;
  bVar3 = false;
  do {
    y_00 = 0;
    do {
      x = 0;
      do {
        bVar1 = DrawTestBase::checkRegionR32I
                          ((DrawTestBase *)this,x,y_00,0x20,0x20,-(uint)(x != 0 || y_00 != 0),
                           local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar2 * 0x4000);
        if (!bVar1) goto LAB_00dd15b4;
        x = x + 1;
      } while (x != 4);
      y_00 = y_00 + 1;
    } while (y_00 != 4);
    bVar3 = 0xe < uVar2;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x10);
  bVar3 = true;
LAB_00dd15b4:
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool ScissorClear::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */, GLuint /*draw_call_index */)
{
	static const GLuint layer_size = m_width * m_height;

	bool check_result = true;

	std::vector<GLint> texture_data;
	texture_data.resize(layer_size * m_depth);
	texture_0.get(GL_RED_INTEGER, GL_INT, &texture_data[0]);

	/* 16 layers, only region corresponding with scissor box 0 should be modified */
	for (GLuint layer = 0; layer < m_depth; ++layer)
	{
		for (GLuint y = 0; y < 4; ++y)
		{
			for (GLuint x = 0; x < 4; ++x)
			{
				GLint* layer_data = &texture_data[layer * layer_size];

				GLint expected_value = -1;
				if ((0 == x) && (0 == y))
				{
					expected_value = 0;
				}

				bool result = checkRegionR32I(x, y, expected_value, layer_data);

				if (false == result)
				{
					check_result = false;
					goto end;
				}
			}
		}
	}

end:
	return check_result;
}